

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

idx_t duckdb::ColumnSegment::FilterSelection
                (SelectionVector *sel,Vector *vector,UnifiedVectorFormat *vdata,TableFilter *filter,
                TableFilterState *filter_state,idx_t scan_count,idx_t *approved_tuple_count)

{
  PhysicalType PVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  double predicate;
  long lVar4;
  bool predicate_00;
  int8_t predicate_01;
  uint8_t predicate_02;
  int16_t predicate_03;
  uint16_t predicate_04;
  int32_t predicate_05;
  uint32_t predicate_06;
  ConstantFilter *pCVar5;
  ConjunctionAndFilter *pCVar6;
  const_reference pvVar7;
  reference pvVar8;
  type pTVar9;
  StructFilter *pSVar10;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  pointer this_01;
  type vector_00;
  type pTVar11;
  idx_t iVar12;
  ConjunctionOrFilter *pCVar13;
  uint64_t predicate_07;
  int64_t predicate_08;
  string *psVar14;
  InternalException *pIVar15;
  InvalidTypeException *this_02;
  pointer __src;
  element_type *peVar16;
  shared_ptr<duckdb::SelectionData,_true> *other;
  sel_t *psVar17;
  idx_t iVar18;
  idx_t iVar19;
  idx_t iVar20;
  idx_t iVar21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  size_type sVar26;
  ulong uVar27;
  ulong uVar28;
  float predicate_09;
  hugeint_t hVar29;
  uhugeint_t uVar30;
  hugeint_t predicate_10;
  uhugeint_t predicate_11;
  string_t predicate_12;
  idx_t offset;
  SelectionVector current_result_sel;
  UnifiedVectorFormat child_data;
  idx_t chunk_end;
  SelectionVector result_sel_1;
  SelectionVector current_sel;
  ExpressionType in_stack_fffffffffffffee8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
  *local_f8;
  ExpressionExecutor *local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d8;
  undefined1 local_c0 [12];
  undefined4 uStack_b4;
  undefined1 local_b0 [72];
  shared_ptr<duckdb::SelectionData,_true> local_68;
  UnifiedVectorFormat *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  SelectionVector local_48;
  
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
    pCVar5 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
    PVar1 = (vector->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
        predicate_00 = BooleanValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<bool>
                  (vdata,predicate_00,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case UINT8:
        predicate_02 = UTinyIntValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<unsigned_char>
                  (vdata,predicate_02,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case INT8:
        predicate_01 = TinyIntValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<signed_char>
                  (vdata,predicate_01,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case UINT16:
        predicate_04 = USmallIntValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<unsigned_short>
                  (vdata,predicate_04,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case INT16:
        predicate_03 = SmallIntValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<short>
                  (vdata,predicate_03,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case UINT32:
        predicate_06 = UIntegerValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<unsigned_int>
                  (vdata,predicate_06,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case INT32:
        predicate_05 = IntegerValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<int>
                  (vdata,predicate_05,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case UINT64:
        predicate_07 = UBigIntValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<unsigned_long>
                  (vdata,predicate_07,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case INT64:
        predicate_08 = BigIntValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<long>
                  (vdata,predicate_08,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      default:
switchD_0177fb40_caseD_a:
        this_02 = (InvalidTypeException *)__cxa_allocate_exception(0x10);
        local_c0._0_8_ = local_b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c0,"Invalid type for filter pushed down to table comparison","");
        InvalidTypeException::InvalidTypeException(this_02,&vector->type,(string *)local_c0);
        __cxa_throw(this_02,&InvalidTypeException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        predicate_09 = FloatValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<float>
                  (vdata,predicate_09,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9
                  );
        break;
      case DOUBLE:
        predicate = DoubleValue::Get(&pCVar5->constant);
        FilterSelectionSwitch<double>
                  (vdata,predicate,sel,approved_tuple_count,(pCVar5->super_TableFilter).field_0x9);
      }
    }
    else if (PVar1 == VARCHAR) {
      psVar14 = StringValue::Get_abi_cxx11_(&pCVar5->constant);
      __src = (psVar14->_M_dataplus)._M_p;
      local_c0._0_4_ = (undefined4)psVar14->_M_string_length;
      if ((uint)local_c0._0_4_ < 0xd) {
        uStack_b4 = 0;
        local_c0._4_4_ = 0;
        local_c0._8_4_ = 0;
        if (local_c0._0_4_ == 0) {
          __src = (pointer)0x0;
        }
        else {
          switchD_012bc561::default(local_c0 + 4,__src,(ulong)(local_c0._0_4_ & 0xf));
          __src = (pointer)CONCAT44(uStack_b4,local_c0._8_4_);
        }
      }
      else {
        local_c0._4_4_ = *(undefined4 *)__src;
      }
      predicate_12.value.pointer.ptr = (char *)sel;
      predicate_12.value._0_8_ = __src;
      FilterSelectionSwitch<duckdb::string_t>
                ((duckdb *)vdata,(UnifiedVectorFormat *)CONCAT44(local_c0._4_4_,local_c0._0_4_),
                 predicate_12,(SelectionVector *)approved_tuple_count,
                 (idx_t *)(ulong)(byte)(pCVar5->super_TableFilter).field_0x9,
                 in_stack_fffffffffffffee8);
    }
    else if (PVar1 == UINT128) {
      uVar30 = UhugeIntValue::Get(&pCVar5->constant);
      predicate_11.lower = uVar30.upper;
      predicate_11.upper = (uint64_t)sel;
      FilterSelectionSwitch<duckdb::uhugeint_t>
                ((duckdb *)vdata,(UnifiedVectorFormat *)uVar30.lower,predicate_11,
                 (SelectionVector *)approved_tuple_count,
                 (idx_t *)(ulong)(byte)(pCVar5->super_TableFilter).field_0x9,
                 in_stack_fffffffffffffee8);
    }
    else {
      if (PVar1 != INT128) goto switchD_0177fb40_caseD_a;
      hVar29 = HugeIntValue::Get(&pCVar5->constant);
      predicate_10.lower = hVar29.upper;
      predicate_10.upper = (int64_t)sel;
      FilterSelectionSwitch<duckdb::hugeint_t>
                ((duckdb *)vdata,(UnifiedVectorFormat *)hVar29.lower,predicate_10,
                 (SelectionVector *)approved_tuple_count,
                 (idx_t *)(ulong)(byte)(pCVar5->super_TableFilter).field_0x9,
                 in_stack_fffffffffffffee8);
    }
    scan_count = *approved_tuple_count;
    break;
  case IS_NULL:
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      *approved_tuple_count = 0;
      return 0;
    }
    SelectionVector::SelectionVector((SelectionVector *)local_c0,*approved_tuple_count);
    uVar27 = *approved_tuple_count;
    if (uVar27 == 0) {
LAB_0178014e:
      iVar12 = 0;
    }
    else {
      psVar17 = sel->sel_vector;
      puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      psVar3 = vdata->sel->sel_vector;
      iVar12 = 0;
      uVar28 = 0;
      do {
        uVar22 = uVar28;
        if (psVar17 != (sel_t *)0x0) {
          uVar22 = (ulong)psVar17[uVar28];
        }
        uVar24 = uVar22;
        if (psVar3 != (sel_t *)0x0) {
          uVar24 = (ulong)psVar3[uVar22];
        }
        if ((puVar2 != (unsigned_long *)0x0) && ((puVar2[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) == 0))
        {
          *(int *)(CONCAT44(local_c0._4_4_,local_c0._0_4_) + iVar12 * 4) = (int)uVar22;
          iVar12 = iVar12 + 1;
        }
        uVar28 = uVar28 + 1;
      } while (uVar27 != uVar28);
    }
    goto LAB_01780156;
  case IS_NOT_NULL:
    if ((vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) goto LAB_0177fd35;
    SelectionVector::SelectionVector((SelectionVector *)local_c0,*approved_tuple_count);
    uVar27 = *approved_tuple_count;
    if (uVar27 == 0) goto LAB_0178014e;
    psVar17 = sel->sel_vector;
    puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar3 = vdata->sel->sel_vector;
    iVar12 = 0;
    uVar28 = 0;
    do {
      uVar22 = uVar28;
      if (psVar17 != (sel_t *)0x0) {
        uVar22 = (ulong)psVar17[uVar28];
      }
      uVar24 = uVar22;
      if (psVar3 != (sel_t *)0x0) {
        uVar24 = (ulong)psVar3[uVar22];
      }
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) {
        *(int *)(CONCAT44(local_c0._4_4_,local_c0._0_4_) + iVar12 * 4) = (int)uVar22;
        iVar12 = iVar12 + 1;
      }
      uVar28 = uVar28 + 1;
    } while (uVar27 != uVar28);
LAB_01780156:
    shared_ptr<duckdb::SelectionData,_true>::operator=
              (&sel->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)(local_c0 + 8));
    sel->sel_vector = (sel_t *)CONCAT44(local_c0._4_4_,local_c0._0_4_);
LAB_0178019f:
    other = (shared_ptr<duckdb::SelectionData,_true> *)(local_c0 + 8);
    *approved_tuple_count = iVar12;
LAB_017801f9:
    local_b0._16_8_ =
         (other->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    scan_count = iVar12;
LAB_017801fd:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._16_8_);
    }
    break;
  case CONJUNCTION_OR:
    SelectionVector::SelectionVector((SelectionVector *)local_c0,*approved_tuple_count);
    pCVar13 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    if ((pCVar13->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pCVar13->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iVar12 = 0;
    }
    else {
      local_f8 = &(pCVar13->super_ConjunctionFilter).child_filters;
      local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&sel->selection_data;
      local_f0 = (ExpressionExecutor *)(filter_state + 1);
      iVar12 = 0;
      sVar26 = 0;
      local_58 = vdata;
      do {
        pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](local_f8,sVar26);
        pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(pvVar7);
        local_e8._0_8_ = (sel_t *)0x0;
        local_e8._8_8_ = (element_type *)0x0;
        aStack_d8._M_allocated_capacity = 0;
        shared_ptr<duckdb::SelectionData,_true>::operator=
                  ((shared_ptr<duckdb::SelectionData,_true> *)(local_e8 + 8),
                   (shared_ptr<duckdb::SelectionData,_true> *)local_50._M_pi);
        local_e8._0_8_ = sel->sel_vector;
        local_b0._64_8_ = *approved_tuple_count;
        pvVar8 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                               *)local_f0,sVar26);
        pTVar9 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                 ::operator*(pvVar8);
        iVar20 = FilterSelection((SelectionVector *)local_e8,vector,local_58,pTVar11,pTVar9,
                                 scan_count,(idx_t *)(local_b0 + 0x40));
        if (iVar20 != 0) {
          lVar4 = CONCAT44(local_c0._4_4_,local_c0._0_4_);
          iVar18 = 0;
          do {
            iVar19 = iVar18;
            if ((sel_t *)local_e8._0_8_ != (sel_t *)0x0) {
              iVar19 = (idx_t)*(uint *)(local_e8._0_8_ + iVar18 * 4);
            }
            if (iVar12 != 0) {
              iVar21 = 0;
              do {
                iVar23 = iVar21;
                if (lVar4 != 0) {
                  iVar23 = (idx_t)*(uint *)(lVar4 + iVar21 * 4);
                }
                if (iVar23 == iVar19) goto LAB_01780039;
                iVar21 = iVar21 + 1;
              } while (iVar12 != iVar21);
            }
            *(int *)(lVar4 + iVar12 * 4) = (int)iVar19;
            iVar12 = iVar12 + 1;
LAB_01780039:
            iVar18 = iVar18 + 1;
          } while (iVar18 != iVar20);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_d8._M_allocated_capacity !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_d8._M_allocated_capacity
                    );
        }
        sVar26 = sVar26 + 1;
      } while (sVar26 < (ulong)((long)(pCVar13->super_ConjunctionFilter).child_filters.
                                      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar13->super_ConjunctionFilter).child_filters.
                                      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    shared_ptr<duckdb::SelectionData,_true>::operator=
              (&sel->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)(local_c0 + 8));
    sel->sel_vector = (sel_t *)CONCAT44(local_c0._4_4_,local_c0._0_4_);
    goto LAB_0178019f;
  case CONJUNCTION_AND:
    pCVar6 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    if ((pCVar6->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar6->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar26 = 0;
      local_f0 = (ExpressionExecutor *)scan_count;
      do {
        pvVar7 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](&(pCVar6->super_ConjunctionFilter).child_filters,sVar26);
        pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                  operator*(pvVar7);
        pvVar8 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                               *)(filter_state + 1),sVar26);
        pTVar9 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                 ::operator*(pvVar8);
        FilterSelection(sel,vector,vdata,pTVar11,pTVar9,(idx_t)local_f0,approved_tuple_count);
        sVar26 = sVar26 + 1;
      } while (sVar26 < (ulong)((long)(pCVar6->super_ConjunctionFilter).child_filters.
                                      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar6->super_ConjunctionFilter).child_filters.
                                      super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
LAB_0177fd35:
    scan_count = *approved_tuple_count;
    break;
  case STRUCT_EXTRACT:
    pSVar10 = TableFilter::Cast<duckdb::StructFilter>(filter);
    this = StructVector::GetEntries(vector);
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::operator[](this,pSVar10->child_idx);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
    this_01 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                        (this_00);
    Vector::ToUnifiedFormat(this_01,scan_count,(UnifiedVectorFormat *)local_c0);
    vector_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_00);
    pTVar11 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
              operator*(&pSVar10->child_filter);
    scan_count = FilterSelection(sel,vector_00,(UnifiedVectorFormat *)local_c0,pTVar11,filter_state,
                                 scan_count,approved_tuple_count);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._48_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._48_8_);
    }
    goto LAB_017801fd;
  case OPTIONAL_FILTER:
    break;
  default:
    pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
    local_c0._0_8_ = local_b0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,"FIXME: unsupported type for filter selection","");
    InternalException::InternalException(pIVar15,(string *)local_c0);
    __cxa_throw(pIVar15,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case EXPRESSION_FILTER:
    SelectionVector::SelectionVector((SelectionVector *)(local_b0 + 0x40),*approved_tuple_count);
    if (scan_count < 0x801) {
      DataChunk::DataChunk((DataChunk *)local_c0);
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)local_c0,vector);
      local_b0._8_8_ = scan_count;
      iVar12 = ExpressionExecutor::SelectExpression
                         ((ExpressionExecutor *)(filter_state + 1),(DataChunk *)local_c0,
                          (SelectionVector *)(local_b0 + 0x40),
                          (optional_ptr<duckdb::SelectionVector,_true>)sel,*approved_tuple_count);
      *approved_tuple_count = iVar12;
      DataChunk::~DataChunk((DataChunk *)local_c0);
    }
    else {
      local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      SelectionVector::SelectionVector(&local_48,*approved_tuple_count);
      if (local_100 < scan_count) {
        local_f0 = (ExpressionExecutor *)(filter_state + 1);
        uVar27 = 0;
        local_f8 = (vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                    *)0x0;
        do {
          peVar16 = (element_type *)(scan_count - (long)local_100);
          if ((element_type *)0x7ff < peVar16) {
            peVar16 = (element_type *)0x800;
          }
          local_b0._56_8_ =
               (long)&(peVar16->owned_data).
                      super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                      .super__Head_base<0UL,_unsigned_long_*,_false> +
               (long)&local_100->_vptr__Sp_counted_base;
          DataChunk::DataChunk((DataChunk *)local_c0);
          ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
          emplace_back<duckdb::Vector&,unsigned_long&,unsigned_long&>
                    ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)local_c0,vector,
                     (unsigned_long *)&local_100,(unsigned_long *)(local_b0 + 0x38));
          uVar28 = *approved_tuple_count;
          iVar12 = uVar28 - uVar27;
          local_b0._8_8_ = peVar16;
          if (uVar28 < uVar27 || iVar12 == 0) {
LAB_0177fed2:
            local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(peVar16->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false> +
                        (long)&local_100->_vptr__Sp_counted_base);
          }
          else {
            psVar17 = sel->sel_vector;
            iVar20 = 0;
            do {
              if (psVar17 == (sel_t *)0x0) {
                p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iVar20 + uVar27);
              }
              else {
                p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (ulong)psVar17[uVar27 + iVar20];
              }
              if ((ulong)local_b0._56_8_ <= p_Var25) {
                uVar28 = uVar27 + iVar20;
                iVar12 = iVar20;
                break;
              }
              if (p_Var25 < local_100) {
                pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
                local_e8._0_8_ = &aStack_d8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_e8,"sel_index < offset in expression filter","");
                InternalException::InternalException(pIVar15,(string *)local_e8);
                __cxa_throw(pIVar15,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              local_48.sel_vector[iVar20] = (int)p_Var25 - (int)local_100;
              iVar20 = iVar20 + 1;
            } while (iVar12 != iVar20);
            uVar27 = uVar28;
            if (iVar12 == 0) goto LAB_0177fed2;
            psVar17 = (sel_t *)(local_b0._64_8_ + local_f8 * 4);
            local_e8._8_8_ = (element_type *)0x0;
            aStack_d8._M_allocated_capacity = 0;
            local_e8._0_8_ = psVar17;
            iVar12 = ExpressionExecutor::SelectExpression
                               (local_f0,(DataChunk *)local_c0,(SelectionVector *)local_e8,&local_48
                                ,iVar12);
            if (iVar12 != 0) {
              iVar20 = 0;
              do {
                psVar17[iVar20] = psVar17[iVar20] + (int)local_100;
                iVar20 = iVar20 + 1;
              } while (iVar12 != iVar20);
            }
            local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(peVar16->owned_data).
                                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false> +
                        (long)&local_100->_vptr__Sp_counted_base);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_d8._M_allocated_capacity !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         aStack_d8._M_allocated_capacity);
            }
            local_f8 = (vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                        *)((long)&(local_f8->
                                  super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                  ).
                                  super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + iVar12);
          }
          DataChunk::~DataChunk((DataChunk *)local_c0);
        } while (local_100 < scan_count);
      }
      else {
        local_f8 = (vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                    *)0x0;
      }
      *approved_tuple_count = (idx_t)local_f8;
      if (local_48.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    other = &local_68;
    shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,other);
    sel->sel_vector = (sel_t *)local_b0._64_8_;
    iVar12 = *approved_tuple_count;
    goto LAB_017801f9;
  }
  return scan_count;
}

Assistant:

idx_t ColumnSegment::FilterSelection(SelectionVector &sel, Vector &vector, UnifiedVectorFormat &vdata,
                                     const TableFilter &filter, TableFilterState &filter_state, idx_t scan_count,
                                     idx_t &approved_tuple_count) {
	switch (filter.filter_type) {
	case TableFilterType::OPTIONAL_FILTER: {
		return scan_count;
	}
	case TableFilterType::CONJUNCTION_OR: {
		// similar to the CONJUNCTION_AND, but we need to take care of the SelectionVectors (OR all of them)
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		idx_t count_total = 0;
		SelectionVector result_sel(approved_tuple_count);
		auto &conjunction_or = filter.Cast<ConjunctionOrFilter>();
		for (idx_t child_idx = 0; child_idx < conjunction_or.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_or.child_filters[child_idx];
			SelectionVector temp_sel;
			temp_sel.Initialize(sel);
			idx_t temp_tuple_count = approved_tuple_count;
			idx_t temp_count = FilterSelection(temp_sel, vector, vdata, child_filter, *state.child_states[child_idx],
			                                   scan_count, temp_tuple_count);
			// tuples passed, move them into the actual result vector
			for (idx_t i = 0; i < temp_count; i++) {
				auto new_idx = temp_sel.get_index(i);
				bool is_new_idx = true;
				for (idx_t res_idx = 0; res_idx < count_total; res_idx++) {
					if (result_sel.get_index(res_idx) == new_idx) {
						is_new_idx = false;
						break;
					}
				}
				if (is_new_idx) {
					result_sel.set_index(count_total++, new_idx);
				}
			}
		}
		sel.Initialize(result_sel);
		approved_tuple_count = count_total;
		return approved_tuple_count;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction_and.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction_and.child_filters[child_idx];
			FilterSelection(sel, vector, vdata, child_filter, *state.child_states[child_idx], scan_count,
			                approved_tuple_count);
		}
		return approved_tuple_count;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		switch (vector.GetType().InternalType()) {
		case PhysicalType::UINT8: {
			auto predicate = UTinyIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint8_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT16: {
			auto predicate = USmallIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint16_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT32: {
			auto predicate = UIntegerValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint32_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT64: {
			auto predicate = UBigIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uint64_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT8: {
			auto predicate = TinyIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int8_t>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT16: {
			auto predicate = SmallIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int16_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT32: {
			auto predicate = IntegerValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int32_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT64: {
			auto predicate = BigIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<int64_t>(vdata, predicate, sel, approved_tuple_count,
			                               constant_filter.comparison_type);
			break;
		}
		case PhysicalType::INT128: {
			auto predicate = HugeIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<hugeint_t>(vdata, predicate, sel, approved_tuple_count,
			                                 constant_filter.comparison_type);
			break;
		}
		case PhysicalType::UINT128: {
			auto predicate = UhugeIntValue::Get(constant_filter.constant);
			FilterSelectionSwitch<uhugeint_t>(vdata, predicate, sel, approved_tuple_count,
			                                  constant_filter.comparison_type);
			break;
		}
		case PhysicalType::FLOAT: {
			auto predicate = FloatValue::Get(constant_filter.constant);
			FilterSelectionSwitch<float>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::DOUBLE: {
			auto predicate = DoubleValue::Get(constant_filter.constant);
			FilterSelectionSwitch<double>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		case PhysicalType::VARCHAR: {
			auto predicate = string_t(StringValue::Get(constant_filter.constant));
			FilterSelectionSwitch<string_t>(vdata, predicate, sel, approved_tuple_count,
			                                constant_filter.comparison_type);
			break;
		}
		case PhysicalType::BOOL: {
			auto predicate = BooleanValue::Get(constant_filter.constant);
			FilterSelectionSwitch<bool>(vdata, predicate, sel, approved_tuple_count, constant_filter.comparison_type);
			break;
		}
		default:
			throw InvalidTypeException(vector.GetType(), "Invalid type for filter pushed down to table comparison");
		}
		return approved_tuple_count;
	}
	case TableFilterType::IS_NULL: {
		return TemplatedNullSelection<true>(vdata, sel, approved_tuple_count);
	}
	case TableFilterType::IS_NOT_NULL: {
		return TemplatedNullSelection<false>(vdata, sel, approved_tuple_count);
	}
	case TableFilterType::STRUCT_EXTRACT: {
		auto &struct_filter = filter.Cast<StructFilter>();
		// Apply the filter on the child vector
		auto &child_vec = StructVector::GetEntries(vector)[struct_filter.child_idx];
		UnifiedVectorFormat child_data;
		child_vec->ToUnifiedFormat(scan_count, child_data);
		return FilterSelection(sel, *child_vec, child_data, *struct_filter.child_filter, filter_state, scan_count,
		                       approved_tuple_count);
	}
	case TableFilterType::EXPRESSION_FILTER: {
		auto &state = filter_state.Cast<ExpressionFilterState>();
		SelectionVector result_sel(approved_tuple_count);
		if (scan_count > STANDARD_VECTOR_SIZE) {
			// scan count is > vector size - split up the vector into multiple chunks
			idx_t offset = 0;
			idx_t result_offset = 0;
			idx_t current_sel_offset = 0;
			SelectionVector current_sel(approved_tuple_count);
			while (offset < scan_count) {
				idx_t chunk_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, scan_count - offset);
				idx_t chunk_end = offset + chunk_count;
				DataChunk chunk;
				chunk.data.emplace_back(vector, offset, chunk_end);
				chunk.SetCardinality(chunk_count);

				// construct the relevant selection vector for the current chunk (offset ... offset + chunk_count)
				idx_t current_count = 0;
				for (; current_sel_offset < approved_tuple_count; current_sel_offset++) {
					auto sel_index = sel.get_index(current_sel_offset);
					if (sel_index >= chunk_end) {
						// exhausted the chunk
						break;
					}
					if (sel_index < offset) {
						throw InternalException("sel_index < offset in expression filter");
					}
					current_sel.set_index(current_count++, sel_index - offset);
				}
				if (current_count == 0) {
					// no matching tuples in this chunk
					offset += chunk_count;
					continue;
				}
				auto current_result_data = result_sel.data() + result_offset;
				SelectionVector current_result_sel(current_result_data);
				idx_t new_matches =
				    state.executor.SelectExpression(chunk, current_result_sel, current_sel, current_count);
				// increment all matches by the offset
				for (idx_t i = 0; i < new_matches; i++) {
					current_result_data[i] += offset;
				}
				result_offset += new_matches;
				offset += chunk_count;
			}
			approved_tuple_count = result_offset;
		} else {
			// standard case: we can handle everything at once - run the expression once
			DataChunk chunk;
			chunk.data.emplace_back(vector);
			chunk.SetCardinality(scan_count);
			approved_tuple_count = state.executor.SelectExpression(chunk, result_sel, sel, approved_tuple_count);
		}
		sel.Initialize(result_sel);
		return approved_tuple_count;
	}
	default:
		throw InternalException("FIXME: unsupported type for filter selection");
	}
}